

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O2

void __thiscall
cornerstone::rpc_exception::rpc_exception(rpc_exception *this,string *err,ptr<req_msg> *req)

{
  allocator<char> local_11;
  
  *(undefined ***)this = &PTR__rpc_exception_00177ee8;
  std::__shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>,
             &req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->err_,(err->_M_dataplus)._M_p,&local_11);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req) : req_(req), err_(err.c_str())
    {
    }